

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

void gguf_set_val_i64(gguf_context *ctx,char *key,int64_t val)

{
  int iVar1;
  allocator<char> local_49;
  int64_t local_48;
  char *local_40;
  long *local_38 [2];
  long local_28 [2];
  
  local_48 = val;
  local_40 = key;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,key,&local_49);
  iVar1 = std::__cxx11::string::compare((char *)local_38);
  if (iVar1 != 0) {
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    gguf_remove_key(ctx,key);
    std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<char_const*&,long&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)&ctx->kv,&local_40,&local_48);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0x3a8
             ,"general.alignment must be type u32");
}

Assistant:

void gguf_set_val_i64(struct gguf_context * ctx, const char * key, int64_t val) {
    gguf_check_reserved_keys(key, val);
    gguf_remove_key(ctx, key);
    ctx->kv.emplace_back(key, val);
}